

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

int regcomp(regex_t *__preg,char *__pattern,int __cflags)

{
  char cVar1;
  cat_t *pcVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  re_guts *__ptr;
  long lVar7;
  sop *psVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  uint uVar12;
  uch *puVar13;
  sop *extraout_RDX;
  sop *psVar14;
  ulong uVar15;
  sop sVar16;
  sop *psVar17;
  sop *psVar18;
  uint uVar19;
  ulong uVar20;
  sop *psVar21;
  parse pa;
  
  if ((~__cflags & 0x11U) == 0) {
    return 0x10;
  }
  if ((__cflags & 0x20U) == 0) {
    sVar6 = strlen(__pattern);
  }
  else {
    sVar6 = (long)__preg->used - (long)__pattern;
    if ((char *)__preg->used < __pattern) {
      return 0x10;
    }
  }
  __ptr = (re_guts *)malloc(399);
  if (__ptr == (re_guts *)0x0) {
    return 0xc;
  }
  pa.ssize = (sVar6 >> 1) * 3 + 1;
  if ((ulong)pa.ssize < sVar6 || (ulong)pa.ssize >> 0x3c != 0) {
    free(__ptr);
    return 0x10;
  }
  pa.strip = (sop *)malloc(pa.ssize * 8);
  pa.slen = 0;
  if (pa.strip == (sop *)0x0) {
    free(__ptr);
    return 0xc;
  }
  pa.end = __pattern + sVar6;
  pa.error = 0;
  pa.ncsalloc = 0;
  for (lVar7 = 8; lVar7 != 0x12; lVar7 = lVar7 + 1) {
    pa.pbegin[lVar7 + -8] = 0;
    pa.pbegin[lVar7 + 2] = 0;
  }
  __ptr->csetsize = 0x100;
  *(undefined4 *)((long)&__ptr->setbits + 4) = 0;
  *(undefined8 *)&__ptr->ncsets = 0;
  *(undefined8 *)((long)&__ptr->sets + 4) = 0;
  __ptr->cflags = __cflags;
  __ptr->iflags = 0;
  __ptr->nbol = 0;
  __ptr->neol = 0;
  __ptr->ncategories = 1;
  __ptr->must = (char *)0x0;
  __ptr->mlen = 0;
  __ptr->nsub = 0;
  __ptr->categories = (cat_t *)&__ptr[1].backrefs;
  pa.next = __pattern;
  pa.g = __ptr;
  memset(__ptr->catspace,0,0x100);
  __ptr->backrefs = 0;
  doemit(&pa,0x4000000,0);
  __ptr->firststate = pa.slen + -1;
  if ((__cflags & 1U) == 0) {
    if ((__cflags & 0x10U) == 0) {
      p_bre(&pa,0x80,0x80);
    }
    else {
      if (pa.end <= pa.next) {
        if (pa.error == 0) {
          pa.error = 0xe;
        }
        pa.next = nuls;
        pa.end = nuls;
      }
      while (pa.next < pa.end) {
        cVar1 = *pa.next;
        pa.next = pa.next + 1;
        ordinary(&pa,(int)cVar1);
      }
    }
  }
  else {
    p_ere(&pa,0x80);
  }
  psVar21 = (sop *)0x0;
  doemit(&pa,0x4000000,0);
  __ptr->laststate = pa.slen + -1;
  if (pa.error == 0) {
    pcVar2 = __ptr->categories;
    for (uVar15 = 0xffffffffffffff80; uVar15 != 0x80; uVar15 = uVar15 + 1) {
      if (pcVar2[uVar15] == '\0') {
        uVar20 = (long)(__ptr->ncsets + 7) / 8;
        puVar13 = __ptr->setbits;
        psVar8 = (sop *)(uVar20 & 0xffffffff);
        if ((int)uVar20 < 1) {
          psVar8 = psVar21;
        }
LAB_00103512:
        iVar4 = (int)psVar8;
        psVar8 = (sop *)(ulong)(iVar4 - 1);
        if (iVar4 != 0) {
          if (puVar13[uVar15 & 0xff] == '\0') goto code_r0x0010351e;
          iVar4 = __ptr->ncategories;
          __ptr->ncategories = iVar4 + 1;
          uVar20 = uVar15;
LAB_00103536:
          pcVar2[uVar20] = (cat_t)iVar4;
          while (uVar20 != 0x7f) {
            uVar20 = uVar20 + 1;
            if (pcVar2[uVar20] == '\0') {
              uVar3 = (long)(__ptr->ncsets + 7) / 8;
              puVar13 = __ptr->setbits;
              psVar8 = (sop *)(uVar3 & 0xffffffff);
              if ((int)uVar3 < 1) {
                psVar8 = psVar21;
              }
              while( true ) {
                iVar5 = (int)psVar8;
                psVar8 = (sop *)(ulong)(iVar5 - 1);
                if (iVar5 == 0) goto LAB_00103536;
                if (puVar13[uVar15 & 0xff] != puVar13[uVar20 & 0xff]) break;
                puVar13 = puVar13 + __ptr->csetsize;
              }
            }
          }
        }
      }
    }
  }
  __ptr->nstates = pa.slen;
  psVar8 = (sop *)realloc(pa.strip,pa.slen << 3);
  __ptr->strip = psVar8;
  if (psVar8 == (sop *)0x0) {
    if (pa.error == 0) {
      pa.error = 0xc;
    }
    pa.next = nuls;
    pa.end = nuls;
    __ptr->strip = pa.strip;
LAB_001036ea:
    __ptr->nplus = 0;
    __ptr->magic = 0xd245;
    __preg->allocated = __ptr->nsub;
    __preg->syntax = (reg_syntax_t)__ptr;
    *(undefined4 *)&__preg->buffer = 0xf265;
    regfree(__preg);
    return pa.error;
  }
  if (pa.error != 0) goto LAB_001036ea;
  iVar4 = 0;
  psVar14 = extraout_RDX;
  psVar17 = psVar8 + 1;
LAB_001035c3:
  psVar18 = psVar17 + 1;
  sVar16 = *psVar17;
  uVar12 = (uint)sVar16;
  uVar15 = (ulong)(uVar12 & 0x7c000000) - 0x8000000 >> 0x1a;
  if (uVar15 < 0xe) {
    iVar5 = iVar4;
    if ((0x1880UL >> (uVar15 & 0x3f) & 1) != 0) goto LAB_0010364f;
    if ((0x2200UL >> (uVar15 & 0x3f) & 1) == 0) {
      if (uVar15 == 0) {
        if (iVar4 == 0) {
          psVar14 = psVar17;
        }
        iVar5 = iVar4 + 1;
        goto LAB_0010364f;
      }
      goto LAB_0010363f;
    }
    do {
      psVar17 = psVar17 + ((uint)sVar16 & 0x3ffffff);
      sVar16 = *psVar17;
      uVar12 = (uint)sVar16;
      uVar19 = uVar12 & 0x7c000000;
    } while (uVar19 == 0x44000000);
    psVar18 = psVar17;
    if ((uVar19 != 0x30000000) && (uVar19 != 0x48000000)) {
      *(byte *)&__ptr->iflags = (byte)__ptr->iflags | 4;
      goto LAB_00103783;
    }
  }
LAB_0010363f:
  iVar5 = 0;
  if (__ptr->mlen < iVar4) {
    __ptr->mlen = iVar4;
    psVar21 = psVar14;
  }
LAB_0010364f:
  iVar4 = iVar5;
  psVar17 = psVar18;
  if ((uVar12 & 0x7c000000) == 0x4000000) {
    lVar7 = (long)__ptr->mlen;
    if (lVar7 != 0) {
      pcVar9 = (char *)malloc(lVar7 + 1);
      __ptr->must = pcVar9;
      if (pcVar9 == (char *)0x0) {
        __ptr->mlen = 0;
      }
      else {
        pcVar10 = pcVar9 + lVar7;
        for (; 0 < lVar7; lVar7 = lVar7 + -1) {
          do {
            sVar16 = *psVar21;
            psVar21 = psVar21 + 1;
          } while (((uint)sVar16 & 0x7c000000) != 0x8000000);
          if (pcVar10 <= pcVar9) {
            __assert_fail("cp < g->must + g->mlen",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x68f,"void findmust()");
          }
          *pcVar9 = (char)sVar16;
          pcVar9 = pcVar9 + 1;
        }
        if (pcVar9 != pcVar10) {
          __assert_fail("cp == g->must + g->mlen",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                        ,0x692,"void findmust()");
        }
        *pcVar10 = '\0';
      }
    }
LAB_00103783:
    lVar11 = 0;
    lVar7 = 0;
    do {
      psVar8 = psVar8 + 1;
      uVar12 = (uint)*psVar8 & 0x7c000000;
      if (uVar12 == 0x28000000) {
        if (lVar7 < lVar11) {
          lVar7 = lVar11;
        }
        lVar11 = lVar11 + -1;
      }
      else if (uVar12 == 0x24000000) {
        lVar11 = lVar11 + 1;
      }
    } while (uVar12 != 0x4000000);
    if (lVar11 != 0) {
      *(byte *)&__ptr->iflags = (byte)__ptr->iflags | 4;
    }
    __ptr->nplus = lVar7;
    __ptr->magic = 0xd245;
    __preg->allocated = __ptr->nsub;
    __preg->syntax = (reg_syntax_t)__ptr;
    *(undefined4 *)&__preg->buffer = 0xf265;
    return 0;
  }
  goto LAB_001035c3;
code_r0x0010351e:
  puVar13 = puVar13 + __ptr->csetsize;
  goto LAB_00103512;
}

Assistant:

int				/* 0 success, otherwise REG_something */
regcomp(preg, pattern, cflags)
regex_t *preg;
const char *pattern;
int cflags;
{
	struct parse pa;
	struct re_guts *g;
	struct parse *p = &pa;
	unsigned int i;
	size_t len;

	if ((cflags&REG_EXTENDED) && (cflags&REG_NOSPEC))
		return(REG_INVARG);

	if (cflags&REG_PEND) {
		if (preg->re_endp < pattern)
			return(REG_INVARG);
		len = (size_t) (preg->re_endp - pattern);
	} else
		len = strlen((char *)pattern);

	/* do the mallocs early so failure handling is easy */
	g = (struct re_guts *)malloc(sizeof(struct re_guts) +
							(NC-1)*sizeof(cat_t));
	if (g == NULL)
		return(REG_ESPACE);
	{
	  /* Patched for CERT Vulnerability Note VU#695940, Feb 2015. */
	  size_t new_ssize = len/(size_t)2*(size_t)3 + (size_t)1; /* ugh */
	  if (new_ssize < len || new_ssize > LONG_MAX / sizeof(sop)) {
	    free((char *) g);
	    return REG_INVARG;
	  }
	  p->ssize = (sopno)new_ssize;
	}
	p->strip = (sop *)malloc((size_t)p->ssize * sizeof(sop));
	p->slen = 0;
	if (p->strip == NULL) {
		free((char *)g);
		return(REG_ESPACE);
	}

	/* set things up */
	p->g = g;
	p->next = (char *)pattern;	/* convenience; we do not modify it */
	p->end = p->next + len;
	p->error = 0;
	p->ncsalloc = 0;
	for (i = 0; i < NPAREN; i++) {
		p->pbegin[i] = 0;
		p->pend[i] = 0;
	}
	g->csetsize = NC;
	g->sets = NULL;
	g->setbits = NULL;
	g->ncsets = 0;
	g->cflags = cflags;
	g->iflags = 0;
	g->nbol = 0;
	g->neol = 0;
	g->must = NULL;
	g->mlen = 0;
	g->nsub = 0;
	g->ncategories = 1;	/* category 0 is "everything else" */
	g->categories = &g->catspace[-(CHAR_MIN)];
	(void) memset((char *)g->catspace, 0, NC*sizeof(cat_t));
	g->backrefs = 0;

	/* do it */
	EMIT(OEND, 0);
	g->firststate = THERE();
	if (cflags&REG_EXTENDED)
		p_ere(p, OUT);
	else if (cflags&REG_NOSPEC)
		p_str(p);
	else
		p_bre(p, OUT, OUT);
	EMIT(OEND, 0);
	g->laststate = THERE();

	/* tidy up loose ends and fill things in */
	categorize(p, g);
	stripsnug(p, g);
	findmust(p, g);
	g->nplus = pluscount(p, g);
	g->magic = MAGIC2;
	preg->re_nsub = g->nsub;
	preg->re_g = g;
	preg->re_magic = MAGIC1;
#ifndef REDEBUG
	/* not debugging, so can't rely on the assert() in regexec() */
	if (g->iflags&BAD)
		seterr(p, REG_ASSERT);
#endif

	/* win or lose, we're done */
	if (p->error != 0)	/* lose */
		regfree(preg);
	return(p->error);
}